

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  int arr [10];
  int local_38 [10];
  
  local_38[4] = 0x42;
  local_38[5] = 0x59;
  local_38[6] = 0x5b;
  local_38[7] = 0x67;
  local_38[0] = 10;
  local_38[1] = 0x22;
  local_38[2] = 0x28;
  local_38[3] = 0x34;
  local_38[8] = 0x7b;
  local_38[9] = 0;
  iVar1 = func(local_38,0,10,0x7b);
  iVar2 = func(local_38,0,10,4);
  if (iVar1 != 8) {
    __assert_fail("found == 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                  ,0x1f,"int main()");
  }
  if (iVar2 == -1) {
    return 0;
  }
  __assert_fail("notfound == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                ,0x20,"int main()");
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {10, 34, 40, 52, 66, 89, 91, 103, 123};

  int found = func(arr, 0, n, 123);
  int notfound = func(arr, 0, n, 4);

  assert(found == 8);
  assert(notfound == -1);

  return 0;
}